

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype.cpp
# Opt level: O0

void __thiscall Contact::Contact(Contact *this,string *name,shared_ptr<Address> *address)

{
  bool bVar1;
  shared_ptr<Address> *address_local;
  string *name_local;
  Contact *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)address);
  if (bVar1) {
    std::__shared_ptr_access<Address,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<Address,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)address);
    std::make_shared<Address,Address&>((Address *)&this->work_address);
  }
  else {
    std::shared_ptr<Address>::shared_ptr(&this->work_address,(nullptr_t)0x0);
  }
  return;
}

Assistant:

explicit Contact(std::string name, std::shared_ptr<Address> address)
		:	name{std::move(name)},
			work_address{address ? std::make_shared<Address>(*address) : nullptr}
	{}